

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/DataStructures.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_FeatureTypes_2eproto::InitDefaults();
  DAT_0034e3e0 = (undefined8 *)0x0;
  _DAT_0034e3e8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_0034e3f0 = 0;
  uRam000000000034e3f8 = 0;
  _DAT_0034e400 = 0;
  _StringToInt64Map_MapEntry_default_instance_ = &PTR__MapEntryImpl_0033ed78;
  DAT_0034e408 = 1;
  StringToInt64Map::StringToInt64Map((StringToInt64Map *)&_StringToInt64Map_default_instance_);
  DAT_0034e448 = 1;
  _DAT_0034e470 = 0;
  DAT_0034e458 = (undefined8 *)0x0;
  uRam000000000034e460 = 0;
  _DAT_0034e468 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_0034e478 = 0;
  _Int64ToStringMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_0033eef8;
  DAT_0034e480 = 1;
  Int64ToStringMap::Int64ToStringMap((Int64ToStringMap *)&_Int64ToStringMap_default_instance_);
  DAT_0034e4c0 = 1;
  DAT_0034e4d0 = (undefined8 *)0x0;
  _DAT_0034e4d8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_0034e4e0 = 0;
  uRam000000000034e4e8 = 0;
  _DAT_0034e4f0 = 0;
  _StringToDoubleMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_0033f078;
  DAT_0034e4f8 = 1;
  StringToDoubleMap::StringToDoubleMap((StringToDoubleMap *)&_StringToDoubleMap_default_instance_);
  DAT_0034e538 = 1;
  DAT_0034e548 = (undefined8 *)0x0;
  uRam000000000034e550 = 0;
  _DAT_0034e558 = 0;
  uRam000000000034e560 = 0;
  _DAT_0034e568 = 0;
  _Int64ToDoubleMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_0033f1f8;
  DAT_0034e570 = 1;
  Int64ToDoubleMap::Int64ToDoubleMap((Int64ToDoubleMap *)&_Int64ToDoubleMap_default_instance_);
  DAT_0034e5b0 = 1;
  StringVector::StringVector((StringVector *)&_StringVector_default_instance_);
  DAT_0034e5e8 = 1;
  Int64Vector::Int64Vector((Int64Vector *)&_Int64Vector_default_instance_);
  DAT_0034e618 = 1;
  FloatVector::FloatVector((FloatVector *)&_FloatVector_default_instance_);
  DAT_0034e648 = 1;
  DoubleVector::DoubleVector((DoubleVector *)&_DoubleVector_default_instance_);
  DAT_0034e678 = 1;
  Int64Range::Int64Range((Int64Range *)&_Int64Range_default_instance_);
  DAT_0034e6a8 = 1;
  Int64Set::Int64Set((Int64Set *)&_Int64Set_default_instance_);
  DAT_0034e6d8 = 1;
  DoubleRange::DoubleRange((DoubleRange *)&_DoubleRange_default_instance_);
  DAT_0034e708 = 1;
  DAT_0034e3e0 = &_StringToInt64Map_MapEntry_default_instance_;
  DAT_0034e458 = &_Int64ToStringMap_MapEntry_default_instance_;
  DAT_0034e4d0 = &_StringToDoubleMap_MapEntry_default_instance_;
  DAT_0034e548 = &_Int64ToDoubleMap_MapEntry_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_FeatureTypes_2eproto::InitDefaults();
  _StringToInt64Map_MapEntry_default_instance_.DefaultConstruct();
  _StringToInt64Map_default_instance_.DefaultConstruct();
  _Int64ToStringMap_MapEntry_default_instance_.DefaultConstruct();
  _Int64ToStringMap_default_instance_.DefaultConstruct();
  _StringToDoubleMap_MapEntry_default_instance_.DefaultConstruct();
  _StringToDoubleMap_default_instance_.DefaultConstruct();
  _Int64ToDoubleMap_MapEntry_default_instance_.DefaultConstruct();
  _Int64ToDoubleMap_default_instance_.DefaultConstruct();
  _StringVector_default_instance_.DefaultConstruct();
  _Int64Vector_default_instance_.DefaultConstruct();
  _FloatVector_default_instance_.DefaultConstruct();
  _DoubleVector_default_instance_.DefaultConstruct();
  _Int64Range_default_instance_.DefaultConstruct();
  _Int64Set_default_instance_.DefaultConstruct();
  _DoubleRange_default_instance_.DefaultConstruct();
  _StringToInt64Map_MapEntry_default_instance_.get_mutable()->set_default_instance(_StringToInt64Map_MapEntry_default_instance_.get_mutable());
  _StringToInt64Map_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Int64ToStringMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_Int64ToStringMap_MapEntry_default_instance_.get_mutable());
  _Int64ToStringMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _StringToDoubleMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_StringToDoubleMap_MapEntry_default_instance_.get_mutable());
  _StringToDoubleMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Int64ToDoubleMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_Int64ToDoubleMap_MapEntry_default_instance_.get_mutable());
  _Int64ToDoubleMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
}